

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O0

optional_idx
duckdb::TraverseInternal<duckdb::Node>
          (ART *art,reference<duckdb::Node> *node,ARTKey *key,idx_t *depth,bool is_mutable)

{
  Node ptr_p;
  byte bVar1;
  NType NVar2;
  bool bVar3;
  GateStatus GVar4;
  optional_idx oVar5;
  ARTKey *in_RCX;
  Node *in_RDX;
  ART *in_RSI;
  reference_wrapper<duckdb::Node> *in_RDI;
  byte in_R8B;
  Prefix prefix;
  optional_idx pos;
  reference_wrapper<duckdb::Node> *__uref;
  reference_wrapper<duckdb::Node> *this;
  _func_int **local_58;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  ART *in_stack_ffffffffffffffc0;
  Prefix *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  optional_idx local_8;
  
  bVar1 = in_R8B & 1;
  do {
    ::std::reference_wrapper<duckdb::Node>::get((reference_wrapper<duckdb::Node> *)in_RSI);
    NVar2 = Node::GetType((Node *)0x18e73f3);
    if (NVar2 != PREFIX) break;
    this = in_RDI;
    ::std::reference_wrapper::operator_cast_to_Node_((reference_wrapper<duckdb::Node> *)0x18e740f);
    local_8 = Prefix::GetMismatchWithKey
                        (in_RSI,in_RDX,in_RCX,(idx_t *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
    bVar3 = optional_idx::IsValid(&local_8);
    if (bVar3) {
      return (optional_idx)local_8.index;
    }
    __uref = in_RDI;
    ::std::reference_wrapper::operator_cast_to_Node_((reference_wrapper<duckdb::Node> *)0x18e7450);
    ptr_p.super_IndexPointer.data._7_1_ = bVar1;
    ptr_p.super_IndexPointer.data._0_7_ = in_stack_ffffffffffffffd0;
    Prefix::Prefix(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,ptr_p,
                   (bool)in_stack_ffffffffffffffbf,(bool)in_stack_ffffffffffffffbe);
    ::std::reference_wrapper<duckdb::Node>::reference_wrapper<duckdb::Node&,void,duckdb::Node*>
              (this,(Node *)__uref);
    (in_RSI->super_BoundIndex).super_Index._vptr_Index = local_58;
    ::std::reference_wrapper<duckdb::Node>::get((reference_wrapper<duckdb::Node> *)in_RSI);
    GVar4 = Node::GetGateStatus((Node *)this);
  } while (GVar4 != GATE_SET);
  oVar5 = optional_idx::Invalid();
  return (optional_idx)oVar5.index;
}

Assistant:

optional_idx TraverseInternal(ART &art, reference<NODE> &node, const ARTKey &key, idx_t &depth,
                              const bool is_mutable = false) {
	D_ASSERT(node.get().HasMetadata());
	D_ASSERT(node.get().GetType() == NType::PREFIX);

	while (node.get().GetType() == NType::PREFIX) {
		auto pos = Prefix::GetMismatchWithKey(art, node, key, depth);
		if (pos.IsValid()) {
			return pos;
		}

		Prefix prefix(art, node, is_mutable);
		node = *prefix.ptr;
		if (node.get().GetGateStatus() == GateStatus::GATE_SET) {
			break;
		}
	}

	// We return an invalid index, if (and only if) the next node is:
	// 1. not a prefix, or
	// 2. a gate.
	return optional_idx::Invalid();
}